

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

QStyle * QApplication::style(void)

{
  QStyle *pQVar1;
  long lVar2;
  QString *style;
  QString *key;
  QStringList *__range3;
  QApplication *this;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QApplicationPrivate::app_style;
  if (QApplicationPrivate::app_style != (QStyle *)0x0) goto LAB_002b9a59;
  lVar2 = QMetaObject::cast((QObject *)&staticMetaObject);
  if (lVar2 == 0) {
LAB_002b9b73:
    pQVar1 = (QStyle *)0x0;
  }
  else {
    QApplicationPrivate::desktopStyleKey();
    QApplicationPrivate::app_style = QStyleFactory::create((QString *)&local_48);
    if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d)->super_QArrayData,2,0x10);
      }
    }
    if (QApplicationPrivate::app_style == (QStyle *)0x0) {
      local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      QStyleFactory::keys();
      if ((undefined1 *)local_48.size != (undefined1 *)0x0) {
        lVar2 = local_48.size * 0x18;
        key = local_48.ptr;
        pQVar1 = QApplicationPrivate::app_style;
        do {
          QApplicationPrivate::app_style = pQVar1;
          lVar2 = lVar2 + -0x18;
          QApplicationPrivate::app_style = QStyleFactory::create(key);
          if (QApplicationPrivate::app_style != (QStyle *)0x0) break;
          key = key + 1;
          pQVar1 = (QStyle *)0x0;
        } while (lVar2 != 0);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
      if (QApplicationPrivate::app_style == (QStyle *)0x0) goto LAB_002b9b73;
    }
    this = (QApplication *)QApplicationPrivate::app_style;
    QObject::setParent(&QApplicationPrivate::app_style->super_QObject);
    QGuiApplicationPrivate::updatePalette();
    if (QApplicationPrivate::styleSheet.d.size == 0) {
      (**(code **)(*(long *)QApplicationPrivate::app_style + 0x70))
                (QApplicationPrivate::app_style,QCoreApplication::self);
      pQVar1 = QApplicationPrivate::app_style;
    }
    else {
      setStyleSheet(this,&QApplicationPrivate::styleSheet);
      pQVar1 = QApplicationPrivate::app_style;
    }
  }
LAB_002b9a59:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return pQVar1;
}

Assistant:

QStyle *QApplication::style()
{
    if (!QApplicationPrivate::app_style) {
        // Create default style
        if (!qobject_cast<QApplication *>(QCoreApplication::instance())) {
            Q_ASSERT(!"No style available without QApplication!");
            return nullptr;
        }

        auto &defaultStyle = QApplicationPrivate::app_style;

        defaultStyle = QStyleFactory::create(QApplicationPrivate::desktopStyleKey());
        if (!defaultStyle) {
            const QStringList styles = QStyleFactory::keys();
            for (const auto &style : styles) {
                if ((defaultStyle = QStyleFactory::create(style)))
                    break;
            }
        }
        if (!defaultStyle) {
            Q_ASSERT(!"No styles available!");
            return nullptr;
        }

        // Take ownership of the style
        defaultStyle->setParent(qApp);

        QGuiApplicationPrivate::updatePalette();

#ifndef QT_NO_STYLE_STYLESHEET
        if (!QApplicationPrivate::styleSheet.isEmpty()) {
            qApp->setStyleSheet(QApplicationPrivate::styleSheet);
        } else
#endif
        {
            defaultStyle->polish(qApp);
        }
    }

    return QApplicationPrivate::app_style;
}